

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

sftp_packet * sftp_wait_for_reply(sftp_request *req)

{
  sftp_packet *pktin;
  sftp_request *psVar1;
  char *pcVar2;
  
  sftp_register(req);
  pktin = sftp_recv();
  if (pktin == (sftp_packet *)0x0) {
    seat_connection_fatal(psftp_seat,"did not receive SFTP response packet from server");
  }
  psVar1 = sftp_find_request(pktin);
  if (psVar1 != req) {
    pcVar2 = fxp_error();
    seat_connection_fatal
              (psftp_seat,"unable to understand SFTP response packet from server: %s",pcVar2);
  }
  return pktin;
}

Assistant:

struct sftp_packet *sftp_wait_for_reply(struct sftp_request *req)
{
    struct sftp_packet *pktin;
    struct sftp_request *rreq;

    sftp_register(req);
    pktin = sftp_recv();
    if (pktin == NULL) {
        seat_connection_fatal(
            psftp_seat, "did not receive SFTP response packet from server");
    }
    rreq = sftp_find_request(pktin);
    if (rreq != req) {
        seat_connection_fatal(
            psftp_seat,
            "unable to understand SFTP response packet from server: %s",
            fxp_error());
    }
    return pktin;
}